

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void to_z80(i386 *i,vector<z80,_std::allocator<z80>_> *instructions)

{
  OpCode op;
  pointer pzVar1;
  pointer pcVar2;
  pointer pzVar3;
  pointer pzVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar5;
  pointer psVar6;
  long *plVar7;
  long lVar8;
  size_type *psVar9;
  pointer pzVar10;
  undefined1 *puVar11;
  string text;
  undefined1 local_128 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_110;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 *local_50;
  undefined1 auStack_40 [16];
  
  switch((i->super_ASMLine).type) {
  case Label:
  case Comment:
    std::vector<z80,std::allocator<z80>>::
    emplace_back<ASMLine::Type_const&,std::__cxx11::string_const&>
              ((vector<z80,std::allocator<z80>> *)instructions,(Type *)i,&(i->super_ASMLine).text);
    return;
  case Instruction:
    pzVar10 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    pzVar1 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_start;
    op = i->opcode;
    local_78._0_4_ = (i->operand1).type;
    local_78._4_4_ = (i->operand1).reg_num;
    pcVar2 = (i->operand1).value._M_dataplus._M_p;
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (i->operand1).value._M_string_length);
    local_a0._0_4_ = (i->operand2).type;
    local_a0._4_4_ = (i->operand2).reg_num;
    pcVar2 = (i->operand2).value._M_dataplus._M_p;
    local_98._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + (i->operand2).value._M_string_length);
    translate_instruction(instructions,op,(Operand *)local_78,(Operand *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    local_128._0_8_ = local_128 + 0x10;
    pcVar2 = (i->line_text)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar2,pcVar2 + (i->line_text)._M_string_length);
    if (*(char *)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128._0_8_)->first)._M_current == '\t') {
      std::__cxx11::string::erase((ulong)local_128,0);
    }
    pzVar3 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pzVar4 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_100 = &uStack_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_128._0_8_,
               (undefined1 *)
               ((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_128._0_8_)->first)._M_current +
               (long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_128._8_8_)->first)._M_current));
    for (pzVar10 = (pointer)((long)pzVar10 + ((long)pzVar3 - (long)pzVar1)); pzVar10 != pzVar4;
        pzVar10 = pzVar10 + 1) {
      std::__cxx11::string::_M_assign((string *)&pzVar10->comment);
    }
    local_50 = auStack_40;
    if (local_100 == &uStack_f0) {
      local_f8 = 0;
      uStack_f0 = 0;
      puVar11 = local_100;
    }
    else {
      lVar8 = CONCAT71(uStack_ef,uStack_f0);
      local_f8 = 0;
      uStack_f0 = 0;
      bVar5 = local_100 != local_50;
      puVar11 = &uStack_f0;
      local_50 = local_100;
      if ((bVar5) &&
         (local_100 = &uStack_f0, operator_delete(local_50,lVar8 + 1), puVar11 = local_100,
         local_100 != &uStack_f0)) {
        operator_delete(local_100,CONCAT71(uStack_ef,uStack_f0) + 1);
        puVar11 = local_100;
      }
    }
    local_100 = puVar11;
    if ((pointer)local_128._0_8_ == (pointer)(local_128 + 0x10)) {
      return;
    }
    puVar11 = (undefined1 *)
              ((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_128._16_8_)->first)._M_current + 1);
    break;
  case Directive:
    local_128._16_8_ = (pointer)0x0;
    _Stack_110._M_current = (char *)0x0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_e0,"\\.asciz\\s(.*)",
               0x10);
    __s._M_current = (i->super_ASMLine).text._M_dataplus._M_p;
    bVar5 = std::__detail::
            __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                      (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(__s._M_current + (i->super_ASMLine).text._M_string_length),
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_128,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_e0,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_e0);
    if (bVar5) {
      lVar8 = local_128._8_8_ - local_128._0_8_;
      if ((lVar8 == 0) || (0xfffffffffffffffd < (lVar8 >> 3) * -0x5555555555555555 - 5U)) {
        psVar6 = (pointer)(local_128._0_8_ + lVar8 + -0x48);
      }
      else {
        psVar6 = (pointer)(local_128._0_8_ + 0x18);
      }
      local_c0 = &local_b0;
      if (psVar6->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_c0,
                   (psVar6->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar6->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_b8 = 0;
        local_b0 = 0;
      }
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x11f3ff);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_e0.field_2._M_allocated_capacity = *psVar9;
        local_e0.field_2._8_8_ = plVar7[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar9;
        local_e0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::vector<z80,std::allocator<z80>>::emplace_back<ASMLine::Type_const&,std::__cxx11::string>
                ((vector<z80,std::allocator<z80>> *)instructions,(Type *)i,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
      }
    }
    if ((pointer)local_128._0_8_ == (pointer)0x0) {
      return;
    }
    puVar11 = (undefined1 *)(local_128._16_8_ - local_128._0_8_);
    break;
  default:
    goto switchD_0011bc24_default;
  }
  operator_delete((void *)local_128._0_8_,(ulong)puVar11);
switchD_0011bc24_default:
  return;
}

Assistant:

void to_z80(const i386& i, std::vector<z80>& instructions) {
	try {
		switch (i.type) {
			case ASMLine::Type::Label:
			case ASMLine::Type::Comment:
				instructions.emplace_back(i.type, i.text);
				return;
			case ASMLine::Type::Directive:
				{
					std::smatch match;
					if (std::regex_match(i.text, match, std::regex(R"(\.asciz\s(.*))"))) {
						instructions.emplace_back(i.type, ".asciiz " + std::string(match[1]));
					}
				}
				return;
			case ASMLine::Type::Instruction:
				const auto head = instructions.size();
				translate_instruction(instructions, i.opcode, i.operand1, i.operand2);

				auto text = i.line_text;
				if (text[0] == '\t') {
					text.erase(0, 1);
				}
				for_each(std::next(instructions.begin(), head), instructions.end(),
						[text](auto& ins) {
							ins.comment = text;
						}
				);
				return;
		}
	}
	catch (const std::exception& e) {
		log(LogLevel::Error, i, e.what());
	}
}